

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall QMetaStringTable::writeBlob(QMetaStringTable *this,char *out)

{
  byte bVar1;
  int i;
  Entry *pEVar2;
  ulong uVar3;
  int offsetOfStringdataMember;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  int stringdataOffset;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->m_entries).d;
  if (pDVar4 == (Data *)0x0) {
    offsetOfStringdataMember = 0;
  }
  else {
    offsetOfStringdataMember = (int)pDVar4->size << 3;
  }
  local_34 = 0;
  writeString(out,0,&this->m_className,offsetOfStringdataMember,&local_34);
  pDVar4 = (this->m_entries).d;
  if (pDVar4 == (Data *)0x0) {
LAB_0028df40:
    uVar5 = 0;
    pDVar4 = (Data *)0x0;
  }
  else if (pDVar4->spans->offsets[0] == 0xff) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (pDVar4->numBuckets == uVar5) goto LAB_0028df40;
      uVar3 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  }
  else {
    uVar5 = 0;
  }
  if (pDVar4 != (Data *)0x0 || uVar5 != 0) {
    do {
      pEVar2 = pDVar4->spans[uVar5 >> 7].entries;
      bVar1 = pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f];
      i = *(int *)(pEVar2[bVar1].storage.data + 0x18);
      if (i != 0) {
        writeString(out,i,(QByteArray *)(pEVar2 + bVar1),offsetOfStringdataMember,&local_34);
      }
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar4 != (Data *)0x0) || (uVar5 != 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMetaStringTable::writeBlob(char *out) const
{
    Q_ASSERT(!(reinterpret_cast<quintptr>(out) & (preferredAlignment() - 1)));

    int offsetOfStringdataMember = int(m_entries.size() * 2 * sizeof(uint));
    int stringdataOffset = 0;

    // qt_metacast expects the first string in the string table to be the class name.
    writeString(out, /*index*/ 0, m_className, offsetOfStringdataMember, stringdataOffset);

    for (Entries::ConstIterator it = m_entries.constBegin(), end = m_entries.constEnd();
         it != end; ++it) {
        const int i = it.value();
        if (i == 0)
            continue;
        const QByteArray &str = it.key();

        writeString(out, i, str, offsetOfStringdataMember, stringdataOffset);
    }
}